

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void ft_var_to_normalized(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Fixed *normalized)

{
  FT_Memory memory_00;
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  long lVar3;
  GX_AVarTable pGVar4;
  FT_Fixed *pFVar5;
  FT_ItemVarDelta FVar6;
  FT_Long FVar7;
  FT_Pointer P;
  long local_b8;
  long local_b0;
  FT_Long local_a8;
  FT_Long local_a0;
  uint local_98;
  FT_UInt idx;
  FT_Int delta;
  FT_UInt outerIndex;
  FT_UInt innerIndex;
  FT_Fixed v;
  GX_AVarTable table;
  FT_Fixed coord;
  FT_Fixed *old_normalized;
  FT_Fixed *new_normalized;
  GX_AVarSegment av;
  FT_Var_Axis *a;
  FT_MM_Var *mmvar;
  GX_Blend blend;
  FT_UInt j;
  FT_UInt i;
  FT_Memory memory;
  FT_Fixed *pFStack_28;
  FT_Error error;
  FT_Fixed *normalized_local;
  FT_Fixed *coords_local;
  TT_Face pTStack_10;
  FT_UInt num_coords_local;
  TT_Face face_local;
  
  memory._4_4_ = 0;
  memory_00 = (face->root).memory;
  pGVar1 = face->blend;
  pFVar2 = pGVar1->mmvar;
  coords_local._4_4_ = num_coords;
  if (pFVar2->num_axis < num_coords) {
    coords_local._4_4_ = pFVar2->num_axis;
  }
  av = (GX_AVarSegment)pFVar2->axis;
  pFStack_28 = normalized;
  normalized_local = coords;
  pTStack_10 = face;
  for (blend._4_4_ = 0; blend._4_4_ < coords_local._4_4_; blend._4_4_ = blend._4_4_ + 1) {
    lVar3 = normalized_local[blend._4_4_];
    if (*(long *)(av + 1) < lVar3) {
      if (lVar3 < (long)av[1].correspondence) {
        local_a0 = FT_DivFix(lVar3 - *(long *)(av + 1),
                             (long)av[1].correspondence - *(long *)(av + 1));
      }
      else {
        local_a0 = 0x10000;
      }
      pFStack_28[blend._4_4_] = local_a0;
    }
    else if (lVar3 < *(long *)(av + 1)) {
      if ((long)av->correspondence < lVar3) {
        local_a8 = FT_DivFix(lVar3 - *(long *)(av + 1),*(long *)(av + 1) - (long)av->correspondence)
        ;
      }
      else {
        local_a8 = -0x10000;
      }
      pFStack_28[blend._4_4_] = local_a8;
    }
    else {
      pFStack_28[blend._4_4_] = 0;
    }
    av = av + 3;
  }
  for (; blend._4_4_ < pFVar2->num_axis; blend._4_4_ = blend._4_4_ + 1) {
    pFStack_28[blend._4_4_] = 0;
  }
  if (pGVar1->avar_table != (GX_AVarTable)0x0) {
    pGVar4 = pGVar1->avar_table;
    if (pGVar4->avar_segment != (GX_AVarSegment)0x0) {
      new_normalized = (FT_Fixed *)pGVar4->avar_segment;
      for (blend._4_4_ = 0; blend._4_4_ < pFVar2->num_axis; blend._4_4_ = blend._4_4_ + 1) {
        for (blend._0_4_ = 1; (uint)blend < (ushort)*new_normalized; blend._0_4_ = (uint)blend + 1)
        {
          if (pFStack_28[blend._4_4_] < *(long *)(new_normalized[1] + (ulong)(uint)blend * 0x10)) {
            FVar7 = FT_MulDiv(pFStack_28[blend._4_4_] -
                              *(long *)(new_normalized[1] + (ulong)((uint)blend - 1) * 0x10),
                              *(long *)(new_normalized[1] + (ulong)(uint)blend * 0x10 + 8) -
                              *(long *)(new_normalized[1] + (ulong)((uint)blend - 1) * 0x10 + 8),
                              *(long *)(new_normalized[1] + (ulong)(uint)blend * 0x10) -
                              *(long *)(new_normalized[1] + (ulong)((uint)blend - 1) * 0x10));
            pFStack_28[blend._4_4_] =
                 FVar7 + *(long *)(new_normalized[1] + (ulong)((uint)blend - 1) * 0x10 + 8);
            break;
          }
        }
        new_normalized = new_normalized + 2;
      }
    }
    if (((pGVar4->itemStore).varData != (GX_ItemVarData)0x0) &&
       (P = ft_mem_qrealloc(memory_00,8,0,(ulong)pFVar2->num_axis,(void *)0x0,
                            (FT_Error *)((long)&memory + 4)), memory._4_4_ == 0)) {
      pFVar5 = pTStack_10->blend->normalizedcoords;
      pTStack_10->blend->normalizedcoords = pFStack_28;
      for (blend._4_4_ = 0; blend._4_4_ < pFVar2->num_axis; blend._4_4_ = blend._4_4_ + 1) {
        local_b0 = pFStack_28[blend._4_4_];
        delta = blend._4_4_;
        idx = 0;
        if ((pGVar4->axisMap).innerIndex != (FT_UInt *)0x0) {
          local_98 = blend._4_4_;
          if ((pGVar4->axisMap).mapCount <= (ulong)blend._4_4_) {
            local_98 = (int)(pGVar4->axisMap).mapCount - 1;
          }
          idx = (pGVar4->axisMap).outerIndex[local_98];
          delta = (pGVar4->axisMap).innerIndex[local_98];
        }
        FVar6 = tt_var_get_item_delta(pTStack_10,&pGVar4->itemStore,idx,delta);
        local_b0 = (FVar6 << 2) + local_b0;
        if (0xffff < local_b0) {
          local_b0 = 0x10000;
        }
        if (local_b0 < -0xffff) {
          local_b8 = -0x10000;
        }
        else {
          local_b8 = local_b0;
        }
        *(long *)((long)P + (ulong)blend._4_4_ * 8) = local_b8;
      }
      for (blend._4_4_ = 0; blend._4_4_ < pFVar2->num_axis; blend._4_4_ = blend._4_4_ + 1) {
        pFStack_28[blend._4_4_] = *(FT_Fixed *)((long)P + (ulong)blend._4_4_ * 8);
      }
      pTStack_10->blend->normalizedcoords = pFVar5;
      ft_mem_free(memory_00,P);
    }
  }
  return;
}

Assistant:

static void
  ft_var_to_normalized( TT_Face    face,
                        FT_UInt    num_coords,
                        FT_Fixed*  coords,
                        FT_Fixed*  normalized )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = face->root.memory;
    FT_UInt    i, j;

    GX_Blend        blend;
    FT_MM_Var*      mmvar;
    FT_Var_Axis*    a;
    GX_AVarSegment  av;

    FT_Fixed*  new_normalized = NULL;
    FT_Fixed*  old_normalized;


    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_to_normalized:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    /* Axis normalization is a two-stage process.  First we normalize */
    /* based on the [min,def,max] values for the axis to be [-1,0,1]. */
    /* Then, if there's an `avar' table, we renormalize this range.   */

    a = mmvar->axis;
    for ( i = 0; i < num_coords; i++, a++ )
    {
      FT_Fixed  coord = coords[i];


      FT_TRACE5(( "    %d: %.5f\n", i, (double)coord / 65536 ));
      if ( coord > a->maximum || coord < a->minimum )
      {
        FT_TRACE1(( "ft_var_to_normalized: design coordinate %.5f\n",
                    (double)coord / 65536 ));
        FT_TRACE1(( "                      is out of range [%.5f;%.5f];"
                    " clamping\n",
                    (double)a->minimum / 65536,
                    (double)a->maximum / 65536 ));
      }

      if ( coord > a->def )
        normalized[i] = coord >= a->maximum ?  0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->maximum, a->def ) );
      else if ( coord < a->def )
        normalized[i] = coord <= a->minimum ? -0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->def, a->minimum ) );
      else
        normalized[i] = 0;
    }

    FT_TRACE5(( "\n" ));

    for ( ; i < mmvar->num_axis; i++ )
      normalized[i] = 0;

    if ( blend->avar_table )
    {
      GX_AVarTable  table = blend->avar_table;


      FT_TRACE5(( "normalized design coordinates"
                  " before applying `avar' data:\n" ));

      if ( table->avar_segment )
      {
        av = table->avar_segment;

        for ( i = 0; i < mmvar->num_axis; i++, av++ )
        {
          for ( j = 1; j < (FT_UInt)av->pairCount; j++ )
          {
            if ( normalized[i] < av->correspondence[j].fromCoord )
            {
              FT_TRACE5(( "  %.5f\n", (double)normalized[i] / 65536 ));

              normalized[i] =
                FT_MulDiv( normalized[i] - av->correspondence[j - 1].fromCoord,
                           av->correspondence[j].toCoord -
                             av->correspondence[j - 1].toCoord,
                           av->correspondence[j].fromCoord -
                             av->correspondence[j - 1].fromCoord ) +
                av->correspondence[j - 1].toCoord;
              break;
            }
          }
        }
      }

      if ( table->itemStore.varData )
      {
        if ( FT_QNEW_ARRAY( new_normalized, mmvar->num_axis ) )
          return;

        /* Install our half-normalized coordinates for the next */
        /* Item Variation Store to work with.                   */
        old_normalized                = face->blend->normalizedcoords;
        face->blend->normalizedcoords = normalized;

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          FT_Fixed  v          = normalized[i];
          FT_UInt   innerIndex = i;
          FT_UInt   outerIndex = 0;
          FT_Int    delta;


          if ( table->axisMap.innerIndex )
          {
            FT_UInt  idx = i;


            if ( idx >= table->axisMap.mapCount )
              idx = table->axisMap.mapCount - 1;

            outerIndex = table->axisMap.outerIndex[idx];
            innerIndex = table->axisMap.innerIndex[idx];
          }

          delta = tt_var_get_item_delta( face,
                                         &table->itemStore,
                                         outerIndex,
                                         innerIndex );

	  v += delta << 2;

	  /* Clamp value range. */
	  v = v >=  0x10000L ?  0x10000 : v;
	  v = v <= -0x10000L ? -0x10000 : v;

          new_normalized[i] = v;
        }

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          normalized[i] = new_normalized[i];
        }

        face->blend->normalizedcoords = old_normalized;

        FT_FREE( new_normalized );
      }
    }
  }